

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O0

void movePack_free(MovePack *movePack,_Bool freeMoves)

{
  byte in_SIL;
  ulong *in_RDI;
  unsigned_long i;
  ulong local_18;
  
  if (in_RDI != (ulong *)0x0) {
    if ((in_SIL & 1) != 0) {
      for (local_18 = 0; local_18 < *in_RDI; local_18 = local_18 + 1) {
        move_free((Move *)0x10a76f);
      }
    }
    free((void *)in_RDI[1]);
    free(in_RDI);
  }
  return;
}

Assistant:

void movePack_free(MovePack * movePack, bool freeMoves)
{
	unsigned long i;

	if(!movePack)
		return;

	if(freeMoves)
	{
		for(i=0;i<movePack->movesCount;i++)
		{
			move_free(movePack->moves[i]);
		}
	}
	
	free(movePack->moves);
	free(movePack);
}